

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O0

ssize_t __thiscall
blc::tools::pipe::read_abi_cxx11_(pipe *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  allocator<char> *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  string *str;
  pipe *ppVar2;
  int usec;
  pipe *this_00;
  string *in_stack_ffffffffffffffd8;
  string *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar3;
  allocator<char> *__a;
  pipe *__s;
  
  paVar1 = (allocator<char> *)CONCAT44(in_register_00000034,__fd);
  uVar3 = 0;
  this_00 = (pipe *)&stack0xffffffffffffffee;
  ppVar2 = this;
  __a = paVar1;
  __s = this;
  std::allocator<char>::allocator();
  usec = (int)((ulong)ppVar2 >> 0x20);
  std::__cxx11::string::string<std::allocator<char>>(unaff_retaddr,(char *)__s,__a);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffee);
  if (((byte)paVar1[0x29] & 1) == 1) {
    waitRead(this_00,usec);
  }
  if (((byte)paVar1[0x28] & 1) == 0) {
    push_out((pipe *)CONCAT17(uVar3,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8,(mutex *)this_00);
  }
  else {
    push_out((pipe *)CONCAT17(uVar3,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8,(mutex *)this_00);
  }
  return (ssize_t)this;
}

Assistant:

std::string blc::tools::pipe::read() const {
	std::string str("");

	if (this->_block == true)
		this->waitRead(1000);
	if (this->_master)
		this->push_out(this->_out, &str, this->_outMut);
	else
		this->push_out(this->_in, &str, this->_inMut);
	return (str);
}